

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::Assembler::comment(Assembler *this,char *s,size_t len)

{
  Error EVar1;
  Logger *pLVar2;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if ((EVar1 == 0) && (((this->super_CodeEmitter)._globalOptions & 4) != 0)) {
    pLVar2 = ((this->super_CodeEmitter)._code)->_logger;
    (*pLVar2->_vptr_Logger[2])(pLVar2);
    (*pLVar2->_vptr_Logger[2])(pLVar2,"\n",1);
  }
  return EVar1;
}

Assistant:

Error Assembler::comment(const char* s, size_t len) {
  if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    Logger* logger = _code->getLogger();
    logger->log(s, len);
    logger->log("\n", 1);
    return kErrorOk;
  }
#else
  ASMJIT_UNUSED(s);
  ASMJIT_UNUSED(len);
#endif

  return kErrorOk;
}